

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f * Matrix4f::rotation(Matrix4f *__return_storage_ptr__,Vector3f *rDirection,float radians)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector3f normalizedDirection;
  Vector3f local_1c;
  
  Vector3f::normalized(&local_1c);
  dVar4 = cos((double)radians);
  fVar6 = (float)dVar4;
  dVar4 = sin((double)radians);
  fVar7 = (float)dVar4;
  pfVar5 = Vector3f::x(&local_1c);
  fVar1 = *pfVar5;
  pfVar5 = Vector3f::y(&local_1c);
  fVar2 = *pfVar5;
  pfVar5 = Vector3f::z(&local_1c);
  fVar3 = *pfVar5;
  fVar8 = 1.0 - fVar6;
  fVar9 = fVar1 * fVar2 * fVar8;
  fVar10 = fVar1 * fVar3 * fVar8;
  fVar11 = fVar2 * fVar3 * fVar8;
  __return_storage_ptr__->m_elements[0] = fVar1 * fVar1 * fVar8 + fVar6;
  __return_storage_ptr__->m_elements[1] = fVar9 + fVar3 * fVar7;
  __return_storage_ptr__->m_elements[2] = fVar10 - fVar2 * fVar7;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = fVar9 - fVar3 * fVar7;
  __return_storage_ptr__->m_elements[5] = fVar2 * fVar2 * fVar8 + fVar6;
  __return_storage_ptr__->m_elements[6] = fVar11 + fVar1 * fVar7;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = fVar10 + fVar2 * fVar7;
  __return_storage_ptr__->m_elements[9] = fVar11 - fVar1 * fVar7;
  __return_storage_ptr__->m_elements[10] = fVar3 * fVar3 * fVar8 + fVar6;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::rotation( const Vector3f& rDirection, float radians )
{
	Vector3f normalizedDirection = rDirection.normalized();
	
	float cosTheta = cos( radians );
	float sinTheta = sin( radians );

	float x = normalizedDirection.x();
	float y = normalizedDirection.y();
	float z = normalizedDirection.z();

	return Matrix4f
	(
		x * x * ( 1.0f - cosTheta ) + cosTheta,			y * x * ( 1.0f - cosTheta ) - z * sinTheta,		z * x * ( 1.0f - cosTheta ) + y * sinTheta,		0.0f,
		x * y * ( 1.0f - cosTheta ) + z * sinTheta,		y * y * ( 1.0f - cosTheta ) + cosTheta,			z * y * ( 1.0f - cosTheta ) - x * sinTheta,		0.0f,
		x * z * ( 1.0f - cosTheta ) - y * sinTheta,		y * z * ( 1.0f - cosTheta ) + x * sinTheta,		z * z * ( 1.0f - cosTheta ) + cosTheta,			0.0f,
		0.0f,											0.0f,											0.0f,											1.0f
	);
}